

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextToken(Lexer *this)

{
  uint __c;
  int iVar1;
  void *pvVar2;
  Lexer *in_RSI;
  undefined2 local_62;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  local_60;
  undefined1 local_58 [16];
  Position local_48;
  
  skipSpace(in_RSI);
  in_RSI->currentStartIndex = in_RSI->currentEndIndex;
  __c = in_RSI->currentChar;
  iVar1 = isalpha(__c);
  if ((__c == 0x5f) || (iVar1 != 0)) {
    nextTokenId(this);
  }
  else if (((byte)__c < 0xe) && ((0x2401U >> (__c & 0x1f) & 1) != 0)) {
    nextTokenLine(this);
  }
  else {
    pvVar2 = memchr(")]}",__c,4);
    if (pvVar2 == (void *)0x0) {
      if (__c == 0x27) {
        nextTokenChar(this);
      }
      else if (__c == 0x22) {
        nextTokenString(this);
      }
      else if (__c - 0x30 < 10) {
        nextTokenNum(this);
      }
      else {
        nextTokenOperator((Lexer *)local_58);
        if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
          if (in_RSI->currentChar == -1) {
            nextTokenEOF(this);
          }
          else if (in_RSI->currentChar == 0x23) {
            nextTokenCapability(this);
          }
          else {
            local_62 = LEX_ERR_ID_NOT_JUST_ANYS;
            local_58._12_4_ = 0;
            getCurrentCursor(&local_48,in_RSI);
            std::
            make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                      ((Level *)&local_60,(LexerErrorCode *)&local_62,(Position *)(local_58 + 0xc));
            generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                                *)in_RSI);
            std::
            unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
            ::~unique_ptr(&local_60);
          }
          if ((_func_int **)local_58._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_58._0_8_ + 8))();
          }
        }
        else {
          this->_vptr_Lexer = (_func_int **)local_58._0_8_;
        }
      }
    }
    else {
      nextTokenBracket(this);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextToken() noexcept {
  // Ignore spaces
  skipSpace();
  // set token starting point
  currentStartIndex = currentEndIndex;

  if (std::isalpha(currentChar) || currentChar == '_')
    return nextTokenId();

  if (_isNewLineCharacter(currentChar))
    return nextTokenLine();

  if (std::strchr(")]}", currentChar))
    return nextTokenBracket();

  if (currentChar == '"')
    return nextTokenString();

  if (currentChar == '\'')
    return nextTokenChar();

  if (std::isdigit(currentChar))
    return nextTokenNum();

  std::unique_ptr<Token> result(nextTokenOperator());
  if (result)
    return result;

  if (currentChar == '#')
    return nextTokenCapability();

  if (currentChar == std::char_traits<char>::eof())
    return nextTokenEOF();

  return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_GENERAL_INVALID_CHARACTER,
      getCurrentCursor()));
}